

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall LLVMBC::Instruction::Instruction(Instruction *this,Type *type,ValueKind kind)

{
  ValueKind kind_local;
  Type *type_local;
  Instruction *this_local;
  
  Value::Value(&this->super_Value,type,kind);
  this->is_terminator = false;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&this->operands);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>_>_>
  ::unordered_map(&this->attachments);
  return;
}

Assistant:

Instruction::Instruction(Type *type, ValueKind kind)
    : Value(type, kind)
{
}